

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O2

Fl_Button * fl_add_button(uchar t,int x,int y,int w,int h,char *l)

{
  int iVar1;
  Fl_Button *pFVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,t);
  if (iVar1 - 6U < 2) {
    pFVar2 = (Fl_Button *)operator_new(0x80);
    Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar2,x,y,w,h,l);
  }
  else {
    if (iVar1 == 4) {
      pFVar2 = (Fl_Button *)operator_new(0x80);
      Fl_Repeat_Button::Fl_Repeat_Button((Fl_Repeat_Button *)pFVar2,x,y,w,h,l);
      return pFVar2;
    }
    pFVar2 = (Fl_Button *)operator_new(0x80);
    Fl_Button::Fl_Button(pFVar2,x,y,w,h,l);
  }
  switch(t) {
  case '\x02':
  case '\x04':
  case '\x06':
    break;
  case '\x03':
  case '\a':
    (((Fl_Button *)&pFVar2->super_Fl_Widget)->super_Fl_Widget).type_ = '\x03';
    break;
  case '\x05':
    (((Fl_Button *)&pFVar2->super_Fl_Widget)->super_Fl_Widget).when_ = '\x01';
    break;
  default:
    if (t != 'f') {
      return pFVar2;
    }
  case '\x01':
    (((Fl_Button *)&pFVar2->super_Fl_Widget)->super_Fl_Widget).type_ = t;
  }
  return pFVar2;
}

Assistant:

Fl_Button *fl_add_button(uchar t,int x,int y,int w,int h,const char *l) {
  Fl_Button *b;
  switch (t) {
  case FL_RETURN_BUTTON:
  case FL_HIDDEN_RET_BUTTON:
    b = new Fl_Return_Button(x,y,w,h,l);
    break;
  case FL_TOUCH_BUTTON:
    b = new Fl_Repeat_Button(x,y,w,h,l);
    break;
  default:
    b = new Fl_Button(x,y,w,h,l);
  }
  switch (t) {
  case FL_TOGGLE_BUTTON:
  case FL_RADIO_BUTTON:
    b->type(t);
    break;
  case FL_HIDDEN_BUTTON:
  case FL_HIDDEN_RET_BUTTON:
    b->type(FL_HIDDEN_BUTTON);
    break;
  case FL_INOUT_BUTTON:
    b->when(FL_WHEN_CHANGED);
    break;
  }
  return b;
}